

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

Aggregate * __thiscall
hta::Metric::aggregate_raw
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  double minimum;
  duration dVar1;
  Aggregate other;
  Aggregate other_00;
  pointer pTVar2;
  type partial_duration;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw;
  Aggregate local_90;
  Aggregate partial_interval;
  
  __return_storage_ptr__->minimum = INFINITY;
  __return_storage_ptr__->maximum = -INFINITY;
  __return_storage_ptr__->sum = 0.0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->integral = 0.0;
  (__return_storage_ptr__->active_time).__r = 0;
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[5])(&raw);
  pTVar2 = raw.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pTVar2 == raw.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::_Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~_Vector_base
                (&raw.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>);
      return __return_storage_ptr__;
    }
    dVar1.__r = (pTVar2->time).
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
    if (dVar1.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) break;
    minimum = pTVar2->value;
    if (dVar1.__r <
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      Aggregate::Aggregate
                (&local_90,minimum,
                 (Duration)
                 (dVar1.__r -
                 (long)begin.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r));
      other.maximum = local_90.maximum;
      other.minimum = local_90.minimum;
      other.sum = local_90.sum;
      other.count = local_90.count;
      other.integral = local_90.integral;
      other.active_time.__r = local_90.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other);
    }
    else {
      partial_duration.__r =
           (long)end.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r -
           (long)begin.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r;
      Aggregate::Aggregate
                (&partial_interval,minimum,minimum,0.0,0,(double)partial_duration.__r * minimum,
                 &partial_duration);
      other_00.maximum = partial_interval.maximum;
      other_00.minimum = partial_interval.minimum;
      other_00.sum = partial_interval.sum;
      other_00.count = partial_interval.count;
      other_00.integral = partial_interval.integral;
      other_00.active_time.__r = partial_interval.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
    }
    pTVar2 = pTVar2 + 1;
    begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              dVar1.__r;
  }
  __assert_fail("previous_time <= tv.time",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x78,"Aggregate hta::Metric::aggregate_raw(TimePoint, TimePoint)");
}

Assistant:

Aggregate Metric::aggregate_raw(TimePoint begin, TimePoint end)
{
    Aggregate aggregate;
    const auto raw =
        storage_metric_->get(begin, end, IntervalScope{ Scope::closed, Scope::extended });
    auto previous_time = begin;
    for (auto tv : raw)
    {
        assert(previous_time <= tv.time);
        if (tv.time >= end)
        {
            // We add this for the integral but the point isn't actually in
            auto partial_duration = end - previous_time;
            Aggregate partial_interval{
                tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
            };
            aggregate += partial_interval;
        }
        else
        {
            aggregate += Aggregate(tv.value, tv.time - previous_time);
        }
        previous_time = tv.time;
    }
    return aggregate;
}